

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O3

void xmlDumpEntityDecl(xmlBufferPtr buf,xmlEntityPtr ent)

{
  char *pcVar1;
  xmlChar *pxVar2;
  
  if (ent == (xmlEntityPtr)0x0 || buf == (xmlBufferPtr)0x0) {
    return;
  }
  switch(ent->etype) {
  case XML_INTERNAL_GENERAL_ENTITY:
    pcVar1 = "<!ENTITY ";
    break;
  case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
    pcVar1 = "<!ENTITY ";
    goto LAB_00146d12;
  case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
    xmlBufferWriteChar(buf,"<!ENTITY ");
    xmlBufferWriteCHAR(buf,ent->name);
    if (ent->ExternalID == (xmlChar *)0x0) {
      pcVar1 = " SYSTEM ";
    }
    else {
      xmlBufferWriteChar(buf," PUBLIC ");
      xmlBufferWriteQuotedString(buf,ent->ExternalID);
      pcVar1 = " ";
    }
    xmlBufferWriteChar(buf,pcVar1);
    xmlBufferWriteQuotedString(buf,ent->SystemID);
    if (ent->content != (xmlChar *)0x0) {
      xmlBufferWriteChar(buf," NDATA ");
      pxVar2 = ent->orig;
      if (pxVar2 == (xmlChar *)0x0) {
        pxVar2 = ent->content;
      }
      xmlBufferWriteCHAR(buf,pxVar2);
    }
    goto LAB_00146d8e;
  case XML_INTERNAL_PARAMETER_ENTITY:
    pcVar1 = "<!ENTITY % ";
    break;
  case XML_EXTERNAL_PARAMETER_ENTITY:
    pcVar1 = "<!ENTITY % ";
LAB_00146d12:
    xmlBufferWriteChar(buf,pcVar1);
    xmlBufferWriteCHAR(buf,ent->name);
    if (ent->ExternalID == (xmlChar *)0x0) {
      pcVar1 = " SYSTEM ";
    }
    else {
      xmlBufferWriteChar(buf," PUBLIC ");
      xmlBufferWriteQuotedString(buf,ent->ExternalID);
      pcVar1 = " ";
    }
    xmlBufferWriteChar(buf,pcVar1);
    pxVar2 = ent->SystemID;
    goto LAB_00146d86;
  default:
    __xmlSimpleError(2,0x217,(xmlNodePtr)0x0,
                     "xmlDumpEntitiesDecl: internal: unknown type entity type",(char *)0x0);
    return;
  }
  xmlBufferWriteChar(buf,pcVar1);
  xmlBufferWriteCHAR(buf,ent->name);
  xmlBufferWriteChar(buf," ");
  pxVar2 = ent->orig;
  if (pxVar2 == (xmlChar *)0x0) {
    xmlDumpEntityContent(buf,ent->content);
  }
  else {
LAB_00146d86:
    xmlBufferWriteQuotedString(buf,pxVar2);
  }
LAB_00146d8e:
  xmlBufferWriteChar(buf,">\n");
  return;
}

Assistant:

void
xmlDumpEntityDecl(xmlBufferPtr buf, xmlEntityPtr ent) {
    if ((buf == NULL) || (ent == NULL)) return;
    switch (ent->etype) {
	case XML_INTERNAL_GENERAL_ENTITY:
	    xmlBufferWriteChar(buf, "<!ENTITY ");
	    xmlBufferWriteCHAR(buf, ent->name);
	    xmlBufferWriteChar(buf, " ");
	    if (ent->orig != NULL)
		xmlBufferWriteQuotedString(buf, ent->orig);
	    else
		xmlDumpEntityContent(buf, ent->content);
	    xmlBufferWriteChar(buf, ">\n");
	    break;
	case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
	    xmlBufferWriteChar(buf, "<!ENTITY ");
	    xmlBufferWriteCHAR(buf, ent->name);
	    if (ent->ExternalID != NULL) {
		 xmlBufferWriteChar(buf, " PUBLIC ");
		 xmlBufferWriteQuotedString(buf, ent->ExternalID);
		 xmlBufferWriteChar(buf, " ");
		 xmlBufferWriteQuotedString(buf, ent->SystemID);
	    } else {
		 xmlBufferWriteChar(buf, " SYSTEM ");
		 xmlBufferWriteQuotedString(buf, ent->SystemID);
	    }
	    xmlBufferWriteChar(buf, ">\n");
	    break;
	case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
	    xmlBufferWriteChar(buf, "<!ENTITY ");
	    xmlBufferWriteCHAR(buf, ent->name);
	    if (ent->ExternalID != NULL) {
		 xmlBufferWriteChar(buf, " PUBLIC ");
		 xmlBufferWriteQuotedString(buf, ent->ExternalID);
		 xmlBufferWriteChar(buf, " ");
		 xmlBufferWriteQuotedString(buf, ent->SystemID);
	    } else {
		 xmlBufferWriteChar(buf, " SYSTEM ");
		 xmlBufferWriteQuotedString(buf, ent->SystemID);
	    }
	    if (ent->content != NULL) { /* Should be true ! */
		xmlBufferWriteChar(buf, " NDATA ");
		if (ent->orig != NULL)
		    xmlBufferWriteCHAR(buf, ent->orig);
		else
		    xmlBufferWriteCHAR(buf, ent->content);
	    }
	    xmlBufferWriteChar(buf, ">\n");
	    break;
	case XML_INTERNAL_PARAMETER_ENTITY:
	    xmlBufferWriteChar(buf, "<!ENTITY % ");
	    xmlBufferWriteCHAR(buf, ent->name);
	    xmlBufferWriteChar(buf, " ");
	    if (ent->orig == NULL)
		xmlDumpEntityContent(buf, ent->content);
	    else
		xmlBufferWriteQuotedString(buf, ent->orig);
	    xmlBufferWriteChar(buf, ">\n");
	    break;
	case XML_EXTERNAL_PARAMETER_ENTITY:
	    xmlBufferWriteChar(buf, "<!ENTITY % ");
	    xmlBufferWriteCHAR(buf, ent->name);
	    if (ent->ExternalID != NULL) {
		 xmlBufferWriteChar(buf, " PUBLIC ");
		 xmlBufferWriteQuotedString(buf, ent->ExternalID);
		 xmlBufferWriteChar(buf, " ");
		 xmlBufferWriteQuotedString(buf, ent->SystemID);
	    } else {
		 xmlBufferWriteChar(buf, " SYSTEM ");
		 xmlBufferWriteQuotedString(buf, ent->SystemID);
	    }
	    xmlBufferWriteChar(buf, ">\n");
	    break;
	default:
	    xmlEntitiesErr(XML_DTD_UNKNOWN_ENTITY,
		"xmlDumpEntitiesDecl: internal: unknown type entity type");
    }
}